

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_message.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::csharp::MessageGenerator::Generate
          (MessageGenerator *this,Printer *printer)

{
  ushort *puVar1;
  string *psVar2;
  size_type sVar3;
  FieldDescriptor *pFVar4;
  OneofDescriptor *pOVar5;
  EnumDescriptor *pEVar6;
  Descriptor *pDVar7;
  int iVar8;
  Options *pOVar9;
  Nonnull<char_*> pcVar10;
  FieldGeneratorBase *pFVar11;
  Descriptor *pDVar12;
  Nonnull<const_char_*> failure_msg;
  char *pcVar13;
  Descriptor **ppDVar14;
  size_t sVar15;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *extraout_RDX_00;
  FieldDescriptor *extraout_RDX_01;
  FieldDescriptor *extraout_RDX_02;
  FieldDescriptor *extraout_RDX_03;
  FieldDescriptor *extraout_RDX_04;
  FieldDescriptor *pFVar16;
  ulong uVar17;
  csharp *pcVar18;
  char *in_R9;
  long lVar19;
  EnumDescriptor **ppEVar20;
  long lVar21;
  bool bVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  string_view text;
  string_view text_00;
  string_view text_01;
  string_view text_02;
  string_view text_03;
  string_view text_04;
  string_view text_05;
  string_view text_06;
  string_view text_07;
  string_view text_08;
  string_view text_09;
  string_view text_10;
  string_view text_11;
  string_view text_12;
  string_view text_13;
  string_view text_14;
  string_view text_15;
  string_view text_16;
  string_view text_17;
  string_view text_18;
  string_view text_19;
  string_view text_20;
  string_view text_21;
  string_view text_22;
  string_view text_23;
  string_view text_24;
  string_view text_25;
  string_view text_26;
  string_view input;
  string_view input_00;
  string_view text_27;
  string_view text_28;
  string_view text_29;
  string_view text_30;
  string_view text_31;
  string_view text_32;
  string_view text_33;
  EnumGenerator enumGenerator;
  undefined1 local_148 [48];
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  undefined1 local_f0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0 [2];
  string local_a0;
  ulong local_80;
  pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
  local_78;
  AlphaNum local_60;
  FileDescriptor *descriptor;
  
  vars.
  super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.capacity_ =
       0;
  vars.
  super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.size_ = 0;
  vars.
  super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
  heap_or_soo_.heap.control = absl::lts_20250127::container_internal::kEmptyGroup + 0x10;
  puVar1 = (ushort *)(this->descriptor_->all_names_).payload_;
  ppEVar20 = &enumGenerator.descriptor_;
  enumGenerator.super_SourceGeneratorBase._vptr_SourceGeneratorBase = (_func_int **)ppEVar20;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&enumGenerator,(long)puVar1 + ~(ulong)*puVar1,(long)puVar1 + -1);
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[11]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)local_148,&vars,(char (*) [11])0x63bd2b);
  std::__cxx11::string::operator=((string *)(local_148._8_8_ + 0x10),(string *)&enumGenerator);
  if ((EnumDescriptor **)enumGenerator.super_SourceGeneratorBase._vptr_SourceGeneratorBase !=
      ppEVar20) {
    operator_delete(enumGenerator.super_SourceGeneratorBase._vptr_SourceGeneratorBase,
                    (ulong)&(enumGenerator.descriptor_)->field_0x1);
  }
  SourceGeneratorBase::class_access_level_abi_cxx11_
            ((string *)&enumGenerator,&this->super_SourceGeneratorBase);
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[13]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)local_148,&vars,(char (*) [13])"access_level");
  std::__cxx11::string::operator=((string *)(local_148._8_8_ + 0x10),(string *)&enumGenerator);
  if ((EnumDescriptor **)enumGenerator.super_SourceGeneratorBase._vptr_SourceGeneratorBase !=
      ppEVar20) {
    operator_delete(enumGenerator.super_SourceGeneratorBase._vptr_SourceGeneratorBase,
                    (ulong)&(enumGenerator.descriptor_)->field_0x1);
  }
  pOVar9 = SourceGeneratorBase::options(&this->super_SourceGeneratorBase);
  WriteMessageDocComment(printer,pOVar9,this->descriptor_);
  if ((this->descriptor_->options_->field_0)._impl_.deprecated_ == true) {
    text._M_str = "[global::System.ObsoleteAttribute]\n";
    text._M_len = 0x23;
    io::Printer::Print<>(printer,text);
  }
  AddSerializableAttribute(this,printer);
  text_00._M_str = "[global::System.Diagnostics.DebuggerDisplayAttribute(\"{ToString(),nq}\")]\n";
  text_00._M_len = 0x49;
  io::Printer::Print<>(printer,text_00);
  text_18._M_str = "$access_level$ sealed partial class $class_name$ : ";
  text_18._M_len = 0x33;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,&vars,text_18);
  bVar22 = this->has_extension_ranges_ != false;
  sVar15 = 0x1b;
  if (bVar22) {
    sVar15 = 0x25;
  }
  pcVar13 = "pb::IMessage<$class_name$>\n";
  if (bVar22) {
    pcVar13 = "pb::IExtendableMessage<$class_name$>\n";
  }
  text_19._M_str = pcVar13;
  text_19._M_len = sVar15;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,&vars,text_19);
  text_01._M_str = "#if !GOOGLE_PROTOBUF_REFSTRUCT_COMPATIBILITY_MODE\n";
  text_01._M_len = 0x32;
  io::Printer::Print<>(printer,text_01);
  text_02._M_str = "    , pb::IBufferMessage\n";
  text_02._M_len = 0x19;
  io::Printer::Print<>(printer,text_02);
  text_03._M_str = "#endif\n";
  text_03._M_len = 7;
  io::Printer::Print<>(printer,text_03);
  text_04._M_str = "{\n";
  text_04._M_len = 2;
  io::Printer::Print<>(printer,text_04);
  printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent;
  text_20._M_str =
       "private static readonly pb::MessageParser<$class_name$> _parser = new pb::MessageParser<$class_name$>(() => new $class_name$());\n"
  ;
  text_20._M_len = 0x81;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,&vars,text_20);
  text_05._M_str = "private pb::UnknownFieldSet _unknownFields;\n";
  text_05._M_len = 0x2c;
  io::Printer::Print<>(printer,text_05);
  if (this->has_extension_ranges_ != true) goto LAB_002973c6;
  psVar2 = this->descriptor_->file_->name_;
  pcVar13 = (psVar2->_M_dataplus)._M_p;
  sVar3 = psVar2->_M_string_length;
  if (sVar3 == 0x20) {
    auVar24[0] = -(pcVar13[0x10] == 'd');
    auVar24[1] = -(pcVar13[0x11] == 'e');
    auVar24[2] = -(pcVar13[0x12] == 's');
    auVar24[3] = -(pcVar13[0x13] == 'c');
    auVar24[4] = -(pcVar13[0x14] == 'r');
    auVar24[5] = -(pcVar13[0x15] == 'i');
    auVar24[6] = -(pcVar13[0x16] == 'p');
    auVar24[7] = -(pcVar13[0x17] == 't');
    auVar24[8] = -(pcVar13[0x18] == 'o');
    auVar24[9] = -(pcVar13[0x19] == 'r');
    auVar24[10] = -(pcVar13[0x1a] == '.');
    auVar24[0xb] = -(pcVar13[0x1b] == 'p');
    auVar24[0xc] = -(pcVar13[0x1c] == 'r');
    auVar24[0xd] = -(pcVar13[0x1d] == 'o');
    auVar24[0xe] = -(pcVar13[0x1e] == 't');
    auVar24[0xf] = -(pcVar13[0x1f] == 'o');
    auVar23[0] = -(*pcVar13 == 'g');
    auVar23[1] = -(pcVar13[1] == 'o');
    auVar23[2] = -(pcVar13[2] == 'o');
    auVar23[3] = -(pcVar13[3] == 'g');
    auVar23[4] = -(pcVar13[4] == 'l');
    auVar23[5] = -(pcVar13[5] == 'e');
    auVar23[6] = -(pcVar13[6] == '/');
    auVar23[7] = -(pcVar13[7] == 'p');
    auVar23[8] = -(pcVar13[8] == 'r');
    auVar23[9] = -(pcVar13[9] == 'o');
    auVar23[10] = -(pcVar13[10] == 't');
    auVar23[0xb] = -(pcVar13[0xb] == 'o');
    auVar23[0xc] = -(pcVar13[0xc] == 'b');
    auVar23[0xd] = -(pcVar13[0xd] == 'u');
    auVar23[0xe] = -(pcVar13[0xe] == 'f');
    auVar23[0xf] = -(pcVar13[0xf] == '/');
    auVar23 = auVar23 & auVar24;
    if ((ushort)((ushort)(SUB161(auVar23 >> 7,0) & 1) | (ushort)(SUB161(auVar23 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar23 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar23 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar23 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar23 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar23 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar23 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar23 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar23 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar23 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar23 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar23 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar23 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar23 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar23[0xf] >> 7) << 0xf) == 0xffff) goto LAB_0029738e;
LAB_00297358:
    pcVar13 = "private pb::ExtensionSet<$class_name$> _extensions;\n";
    sVar15 = 0x34;
  }
  else {
    if ((sVar3 != 0x21) ||
       (iVar8 = bcmp(pcVar13,"net/proto2/proto/descriptor.proto",0x21), iVar8 != 0))
    goto LAB_00297358;
LAB_0029738e:
    pcVar13 = "internal pb::ExtensionSet<$class_name$> _extensions;\n";
    sVar15 = 0x35;
  }
  text_21._M_str = pcVar13;
  text_21._M_len = sVar15;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,&vars,text_21);
  text_22._M_str =
       "private pb::ExtensionSet<$class_name$> _Extensions { get { return _extensions; } }\n";
  text_22._M_len = 0x53;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,&vars,text_22);
LAB_002973c6:
  if (0 < this->has_bit_field_count_) {
    iVar8 = 0;
    do {
      ppEVar20 = &enumGenerator.descriptor_;
      pcVar10 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                          (iVar8,(Nonnull<char_*>)ppEVar20);
      enumGenerator.super_SourceGeneratorBase._vptr_SourceGeneratorBase =
           (_func_int **)(pcVar10 + -(long)ppEVar20);
      local_148._0_8_ = local_148 + 0x10;
      enumGenerator.super_SourceGeneratorBase.options_ = (Options *)ppEVar20;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_148,ppEVar20,pcVar10);
      text_06._M_str = "private int _hasBits$i$;\n";
      text_06._M_len = 0x19;
      io::Printer::Print<char[2],std::__cxx11::string>
                (printer,text_06,(char (*) [2])0x6fbf7e,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148);
      if ((undefined1 *)local_148._0_8_ != local_148 + 0x10) {
        operator_delete((void *)local_148._0_8_,local_148._16_8_ + 1);
      }
      iVar8 = iVar8 + 1;
    } while (iVar8 < this->has_bit_field_count_);
  }
  SourceGeneratorBase::WriteGeneratedCodeAttributes(&this->super_SourceGeneratorBase,printer);
  text_23._M_str =
       "public static pb::MessageParser<$class_name$> Parser { get { return _parser; } }\n\n";
  text_23._M_len = 0x52;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,&vars,text_23);
  pDVar12 = this->descriptor_->containing_type_;
  if (pDVar12 == (Descriptor *)0x0) {
    GetReflectionClassName_abi_cxx11_
              ((string *)local_f0,(csharp *)this->descriptor_->file_,descriptor);
    enumGenerator.super_SourceGeneratorBase._vptr_SourceGeneratorBase = (_func_int **)local_f0._8_8_
    ;
    enumGenerator.super_SourceGeneratorBase.options_ = (Options *)local_f0._0_8_;
    local_148._0_8_ = (ctrl_t *)0x19;
    local_148._8_8_ = ".Descriptor.MessageTypes[";
    pDVar12 = this->descriptor_;
    ppDVar14 = &pDVar12->file_->message_types_;
    if (pDVar12->containing_type_ != (Descriptor *)0x0) {
      ppDVar14 = &pDVar12->containing_type_->nested_types_;
    }
    pcVar10 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                        ((int)((ulong)((long)pDVar12 - (long)*ppDVar14) >> 5) * -0x33333333,
                         local_c0[0]._M_local_buf);
    local_d0._M_allocated_capacity = (size_type)(pcVar10 + -(long)local_c0);
    local_60.piece_._M_len = 1;
    local_60.piece_._M_str = "]";
    local_d0._8_8_ = local_c0;
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_a0,(lts_20250127 *)&enumGenerator,(AlphaNum *)local_148,(AlphaNum *)&local_d0,
               &local_60,(AlphaNum *)in_R9);
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[20]>(&local_78,&vars,(char (*) [20])"descriptor_accessor");
  }
  else {
    GetClassName_abi_cxx11_((string *)local_f0,(csharp *)pDVar12,(Descriptor *)descriptor);
    enumGenerator.super_SourceGeneratorBase._vptr_SourceGeneratorBase = (_func_int **)local_f0._8_8_
    ;
    enumGenerator.super_SourceGeneratorBase.options_ = (Options *)local_f0._0_8_;
    local_148._0_8_ = (ctrl_t *)0x18;
    local_148._8_8_ = ".Descriptor.NestedTypes[";
    pDVar12 = this->descriptor_;
    ppDVar14 = &pDVar12->file_->message_types_;
    if (pDVar12->containing_type_ != (Descriptor *)0x0) {
      ppDVar14 = &pDVar12->containing_type_->nested_types_;
    }
    pcVar10 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                        ((int)((ulong)((long)pDVar12 - (long)*ppDVar14) >> 5) * -0x33333333,
                         local_c0[0]._M_local_buf);
    local_d0._M_allocated_capacity = (size_type)(pcVar10 + -(long)local_c0);
    local_60.piece_._M_len = 1;
    local_60.piece_._M_str = "]";
    local_d0._8_8_ = local_c0;
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_a0,(lts_20250127 *)&enumGenerator,(AlphaNum *)local_148,(AlphaNum *)&local_d0,
               &local_60,(AlphaNum *)in_R9);
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[20]>(&local_78,&vars,(char (*) [20])"descriptor_accessor");
  }
  std::__cxx11::string::operator=
            ((string *)((long)local_78.first.field_1.slot_ + 0x10),(string *)&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if ((Options *)local_f0._0_8_ != (Options *)(local_f0 + 0x10)) {
    operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
  }
  SourceGeneratorBase::WriteGeneratedCodeAttributes(&this->super_SourceGeneratorBase,printer);
  text_24._M_str =
       "public static pbr::MessageDescriptor Descriptor {\n  get { return $descriptor_accessor$; }\n}\n\n"
  ;
  text_24._M_len = 0x5d;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,&vars,text_24);
  SourceGeneratorBase::WriteGeneratedCodeAttributes(&this->super_SourceGeneratorBase,printer);
  text_25._M_str =
       "pbr::MessageDescriptor pb::IMessage.Descriptor {\n  get { return Descriptor; }\n}\n\n";
  text_25._M_len = 0x51;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,&vars,text_25);
  SourceGeneratorBase::WriteGeneratedCodeAttributes(&this->super_SourceGeneratorBase,printer);
  text_26._M_str =
       "public $class_name$() {\n  OnConstruction();\n}\n\npartial void OnConstruction();\n\n";
  text_26._M_len = 0x4f;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,&vars,text_26);
  GenerateCloningCode(this,printer);
  pDVar12 = this->descriptor_;
  if (0 < pDVar12->field_count_) {
    lVar19 = 0;
    lVar21 = 0;
    pFVar16 = extraout_RDX;
    do {
      pFVar4 = pDVar12->fields_;
      puVar1 = *(ushort **)((long)&(pFVar4->all_names_).payload_ + lVar19);
      local_60.piece_._M_len = (size_t)*puVar1;
      local_60.piece_._M_str = (char *)(~local_60.piece_._M_len + (long)puVar1);
      GetFieldConstantName_abi_cxx11_
                ((string *)local_148,(csharp *)(&pFVar4->super_SymbolBase + lVar19),pFVar16);
      ppEVar20 = &enumGenerator.descriptor_;
      pcVar10 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                          (*(int32_t *)((long)&pFVar4->number_ + lVar19),(Nonnull<char_*>)ppEVar20);
      enumGenerator.super_SourceGeneratorBase._vptr_SourceGeneratorBase =
           (_func_int **)(pcVar10 + -(long)ppEVar20);
      enumGenerator.super_SourceGeneratorBase.options_ = (Options *)ppEVar20;
      local_d0._M_allocated_capacity = (size_type)local_c0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,ppEVar20,pcVar10);
      in_R9 = "field_constant_name";
      text_07._M_str =
           "/// <summary>Field number for the \"$field_name$\" field.</summary>\npublic const int $field_constant_name$ = $index$;\n"
      ;
      text_07._M_len = 0x74;
      io::Printer::
      Print<char[11],std::basic_string_view<char,std::char_traits<char>>,char[20],std::__cxx11::string,char[6],std::__cxx11::string>
                (printer,text_07,(char (*) [11])0x5cc263,&local_60.piece_,
                 (char (*) [20])"field_constant_name",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148,
                 (char (*) [6])0x51e287,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_allocated_capacity != local_c0) {
        operator_delete((void *)local_d0._M_allocated_capacity,local_c0[0]._M_allocated_capacity + 1
                       );
      }
      if ((undefined1 *)local_148._0_8_ != local_148 + 0x10) {
        operator_delete((void *)local_148._0_8_,local_148._16_8_ + 1);
      }
      pFVar11 = CreateFieldGeneratorInternal
                          (this,(FieldDescriptor *)(&pFVar4->super_SymbolBase + lVar19));
      (*(pFVar11->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[6])(pFVar11,printer);
      text_08._M_str = "\n";
      text_08._M_len = 1;
      io::Printer::Print<>(printer,text_08);
      (*(pFVar11->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[1])(pFVar11);
      lVar21 = lVar21 + 1;
      pDVar12 = this->descriptor_;
      lVar19 = lVar19 + 0x58;
      pFVar16 = extraout_RDX_00;
    } while (lVar21 < pDVar12->field_count_);
  }
  if (0 < pDVar12->real_oneof_decl_count_) {
    uVar17 = 0;
    do {
      ppEVar20 = &enumGenerator.descriptor_;
      if ((long)pDVar12->oneof_decl_count_ <= (long)uVar17) {
        failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                                (uVar17 & 0xffffffff,(long)pDVar12->oneof_decl_count_,
                                 "index < oneof_decl_count()");
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&enumGenerator,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,0xa89,failure_msg);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&enumGenerator);
      }
      pOVar5 = pDVar12->oneof_decls_;
      puVar1 = (ushort *)pOVar5[uVar17].all_names_.payload_;
      pcVar18 = (csharp *)(ulong)*puVar1;
      input._M_len = (long)puVar1 + ~(ulong)pcVar18;
      input._M_str = (char *)0x0;
      local_80 = uVar17;
      UnderscoresToCamelCase_abi_cxx11_((string *)&enumGenerator,pcVar18,input,false,SUB81(in_R9,0))
      ;
      absl::lts_20250127::container_internal::
      raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
      ::try_emplace_impl<char_const(&)[5]>
                ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                  *)local_148,&vars,(char (*) [5])0x6fff3e);
      std::__cxx11::string::operator=((string *)(local_148._8_8_ + 0x10),(string *)&enumGenerator);
      if ((EnumDescriptor **)enumGenerator.super_SourceGeneratorBase._vptr_SourceGeneratorBase !=
          ppEVar20) {
        operator_delete(enumGenerator.super_SourceGeneratorBase._vptr_SourceGeneratorBase,
                        (ulong)&(enumGenerator.descriptor_)->field_0x1);
      }
      puVar1 = (ushort *)pOVar5[uVar17].all_names_.payload_;
      pcVar18 = (csharp *)(ulong)*puVar1;
      input_00._M_len = (long)puVar1 + ~(ulong)pcVar18;
      input_00._M_str = (char *)0x1;
      UnderscoresToCamelCase_abi_cxx11_
                ((string *)&enumGenerator,pcVar18,input_00,false,SUB81(in_R9,0));
      absl::lts_20250127::container_internal::
      raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
      ::try_emplace_impl<char_const(&)[14]>
                ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                  *)local_148,&vars,(char (*) [14])0x618186);
      std::__cxx11::string::operator=((string *)(local_148._8_8_ + 0x10),(string *)&enumGenerator);
      if ((EnumDescriptor **)enumGenerator.super_SourceGeneratorBase._vptr_SourceGeneratorBase !=
          ppEVar20) {
        operator_delete(enumGenerator.super_SourceGeneratorBase._vptr_SourceGeneratorBase,
                        (ulong)&(enumGenerator.descriptor_)->field_0x1);
      }
      puVar1 = (ushort *)pOVar5[uVar17].all_names_.payload_;
      enumGenerator.super_SourceGeneratorBase._vptr_SourceGeneratorBase = (_func_int **)ppEVar20;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&enumGenerator,(long)puVar1 + ~(ulong)*puVar1,(long)puVar1 + -1);
      absl::lts_20250127::container_internal::
      raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
      ::try_emplace_impl<char_const(&)[14]>
                ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                  *)local_148,&vars,(char (*) [14])"original_name");
      std::__cxx11::string::operator=((string *)(local_148._8_8_ + 0x10),(string *)&enumGenerator);
      if ((EnumDescriptor **)enumGenerator.super_SourceGeneratorBase._vptr_SourceGeneratorBase !=
          ppEVar20) {
        operator_delete(enumGenerator.super_SourceGeneratorBase._vptr_SourceGeneratorBase,
                        (ulong)&(enumGenerator.descriptor_)->field_0x1);
      }
      text_27._M_str =
           "private object $name$_;\n/// <summary>Enum of possible cases for the \"$original_name$\" oneof.</summary>\npublic enum $property_name$OneofCase {\n"
      ;
      text_27._M_len = 0x8e;
      io::Printer::
      Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                (printer,&vars,text_27);
      printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent;
      text_09._M_str = "None = 0,\n";
      text_09._M_len = 10;
      io::Printer::Print<>(printer,text_09);
      if (0 < pOVar5[uVar17].field_count_) {
        lVar19 = 0;
        lVar21 = 0;
        pFVar16 = extraout_RDX_01;
        do {
          pFVar4 = pOVar5[uVar17].fields_;
          GetOneofCaseName_abi_cxx11_
                    ((string *)local_148,(csharp *)(&pFVar4->super_SymbolBase + lVar19),pFVar16);
          ppEVar20 = &enumGenerator.descriptor_;
          pcVar10 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                              (*(int32_t *)((long)&pFVar4->number_ + lVar19),
                               (Nonnull<char_*>)ppEVar20);
          enumGenerator.super_SourceGeneratorBase._vptr_SourceGeneratorBase =
               (_func_int **)(pcVar10 + -(long)ppEVar20);
          local_d0._M_allocated_capacity = (size_type)local_c0;
          enumGenerator.super_SourceGeneratorBase.options_ = (Options *)ppEVar20;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,ppEVar20,pcVar10);
          in_R9 = "index";
          text_10._M_str = "$oneof_case_name$ = $index$,\n";
          text_10._M_len = 0x1d;
          io::Printer::Print<char[16],std::__cxx11::string,char[6],std::__cxx11::string>
                    (printer,text_10,(char (*) [16])"oneof_case_name",(string *)local_148,
                     (char (*) [6])0x51e287,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d0)
          ;
          pFVar16 = extraout_RDX_02;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_allocated_capacity != local_c0) {
            operator_delete((void *)local_d0._M_allocated_capacity,
                            local_c0[0]._M_allocated_capacity + 1);
            pFVar16 = extraout_RDX_03;
          }
          if ((undefined1 *)local_148._0_8_ != local_148 + 0x10) {
            operator_delete((void *)local_148._0_8_,local_148._16_8_ + 1);
            pFVar16 = extraout_RDX_04;
          }
          lVar21 = lVar21 + 1;
          lVar19 = lVar19 + 0x58;
        } while (lVar21 < pOVar5[uVar17].field_count_);
      }
      io::Printer::Outdent(printer);
      text_11._M_str = "}\n";
      text_11._M_len = 2;
      io::Printer::Print<>(printer,text_11);
      text_28._M_str =
           "private $property_name$OneofCase $name$Case_ = $property_name$OneofCase.None;\n";
      text_28._M_len = 0x4e;
      io::Printer::
      Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                (printer,&vars,text_28);
      SourceGeneratorBase::WriteGeneratedCodeAttributes(&this->super_SourceGeneratorBase,printer);
      text_29._M_str =
           "public $property_name$OneofCase $property_name$Case {\n  get { return $name$Case_; }\n}\n\n"
      ;
      text_29._M_len = 0x57;
      io::Printer::
      Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                (printer,&vars,text_29);
      SourceGeneratorBase::WriteGeneratedCodeAttributes(&this->super_SourceGeneratorBase,printer);
      text_30._M_str =
           "public void Clear$property_name$() {\n  $name$Case_ = $property_name$OneofCase.None;\n  $name$_ = null;\n}\n\n"
      ;
      text_30._M_len = 0x69;
      io::Printer::
      Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                (printer,&vars,text_30);
      uVar17 = local_80 + 1;
      pDVar12 = this->descriptor_;
    } while ((long)uVar17 < (long)pDVar12->real_oneof_decl_count_);
  }
  GenerateFrameworkMethods(this,printer);
  GenerateMessageSerializationMethods(this,printer);
  GenerateMergingMethods(this,printer);
  if (this->has_extension_ranges_ == true) {
    text_31._M_str =
         "public TValue GetExtension<TValue>(pb::Extension<$class_name$, TValue> extension) {\n  return pb::ExtensionSet.Get(ref _extensions, extension);\n}\npublic pbc::RepeatedField<TValue> GetExtension<TValue>(pb::RepeatedExtension<$class_name$, TValue> extension) {\n  return pb::ExtensionSet.Get(ref _extensions, extension);\n}\npublic pbc::RepeatedField<TValue> GetOrInitializeExtension<TValue>(pb::RepeatedExtension<$class_name$, TValue> extension) {\n  return pb::ExtensionSet.GetOrInitialize(ref _extensions, extension);\n}\npublic void SetExtension<TValue>(pb::Extension<$class_name$, TValue> extension, TValue value) {\n  pb::ExtensionSet.Set(ref _extensions, extension, value);\n}\npublic bool HasExtension<TValue>(pb::Extension<$class_name$, TValue> extension) {\n  return pb::ExtensionSet.Has(ref _extensions, extension);\n}\npublic void ClearExtension<TValue>(pb::Extension<$class_name$, TValue> extension) {\n  pb::ExtensionSet.Clear(ref _extensions, extension);\n}\npublic void ClearExtension<TValue>(pb::RepeatedExtension<$class_name$, TValue> extension) {\n  pb::ExtensionSet.Clear(ref _extensions, extension);\n}\n\n"
    ;
    text_31._M_len = 0x450;
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,&vars,text_31);
  }
  pDVar12 = this->descriptor_;
  if (pDVar12->enum_type_count_ < 1) {
    if (0 < (long)pDVar12->nested_type_count_) {
      lVar19 = 0;
      do {
        if (*(char *)(*(long *)((long)&pDVar12->nested_types_->options_ + lVar19) + 0x53) == '\0')
        goto LAB_00297c35;
        lVar19 = lVar19 + 0xa0;
      } while ((long)pDVar12->nested_type_count_ * 0xa0 != lVar19);
    }
  }
  else {
LAB_00297c35:
    text_32._M_str =
         "#region Nested types\n/// <summary>Container for nested types declared in the $class_name$ message type.</summary>\n"
    ;
    text_32._M_len = 0x72;
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,&vars,text_32);
    SourceGeneratorBase::WriteGeneratedCodeAttributes(&this->super_SourceGeneratorBase,printer);
    text_12._M_str = "public static partial class Types {\n";
    text_12._M_len = 0x24;
    io::Printer::Print<>(printer,text_12);
    printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent;
    pDVar12 = this->descriptor_;
    if (0 < pDVar12->enum_type_count_) {
      lVar21 = 0;
      lVar19 = 0;
      do {
        pEVar6 = pDVar12->enum_types_;
        pOVar9 = SourceGeneratorBase::options(&this->super_SourceGeneratorBase);
        EnumGenerator::EnumGenerator
                  (&enumGenerator,(EnumDescriptor *)(&pEVar6->super_SymbolBase + lVar21),pOVar9);
        EnumGenerator::Generate(&enumGenerator,printer);
        EnumGenerator::~EnumGenerator(&enumGenerator);
        lVar19 = lVar19 + 1;
        pDVar12 = this->descriptor_;
        lVar21 = lVar21 + 0x58;
      } while (lVar19 < pDVar12->enum_type_count_);
    }
    if (0 < pDVar12->nested_type_count_) {
      lVar21 = 0;
      lVar19 = 0;
      do {
        pDVar7 = pDVar12->nested_types_;
        if (*(char *)(*(long *)((long)&pDVar7->options_ + lVar21) + 0x53) == '\0') {
          pOVar9 = SourceGeneratorBase::options(&this->super_SourceGeneratorBase);
          MessageGenerator((MessageGenerator *)&enumGenerator,
                           (Descriptor *)(&pDVar7->super_SymbolBase + lVar21),pOVar9);
          Generate((MessageGenerator *)&enumGenerator,printer);
          ~MessageGenerator((MessageGenerator *)&enumGenerator);
          pDVar12 = this->descriptor_;
        }
        lVar19 = lVar19 + 1;
        lVar21 = lVar21 + 0xa0;
      } while (lVar19 < pDVar12->nested_type_count_);
    }
    io::Printer::Outdent(printer);
    text_13._M_str = "}\n#endregion\n\n";
    text_13._M_len = 0xe;
    io::Printer::Print<>(printer,text_13);
    pDVar12 = this->descriptor_;
  }
  if (0 < pDVar12->extension_count_) {
    text_33._M_str =
         "#region Extensions\n/// <summary>Container for extensions for other messages declared in the $class_name$ message type.</summary>\n"
    ;
    text_33._M_len = 0x81;
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,&vars,text_33);
    SourceGeneratorBase::WriteGeneratedCodeAttributes(&this->super_SourceGeneratorBase,printer);
    text_14._M_str = "public static partial class Extensions {\n";
    text_14._M_len = 0x29;
    io::Printer::Print<>(printer,text_14);
    printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent;
    pDVar12 = this->descriptor_;
    if (0 < pDVar12->extension_count_) {
      lVar19 = 0;
      lVar21 = 0;
      do {
        pFVar11 = CreateFieldGeneratorInternal
                            (this,(FieldDescriptor *)
                                  (&pDVar12->extensions_->super_SymbolBase + lVar19));
        (*(pFVar11->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[5])(pFVar11,printer);
        (*(pFVar11->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[1])(pFVar11);
        lVar21 = lVar21 + 1;
        pDVar12 = this->descriptor_;
        lVar19 = lVar19 + 0x58;
      } while (lVar21 < pDVar12->extension_count_);
    }
    io::Printer::Outdent(printer);
    text_15._M_str = "}\n#endregion\n\n";
    text_15._M_len = 0xe;
    io::Printer::Print<>(printer,text_15);
  }
  io::Printer::Outdent(printer);
  text_16._M_str = "}\n";
  text_16._M_len = 2;
  io::Printer::Print<>(printer,text_16);
  text_17._M_str = "\n";
  text_17._M_len = 1;
  io::Printer::Print<>(printer,text_17);
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~raw_hash_set((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&vars);
  return;
}

Assistant:

void MessageGenerator::Generate(io::Printer* printer) {
  absl::flat_hash_map<absl::string_view, std::string> vars;
  vars["class_name"] = class_name();
  vars["access_level"] = class_access_level();

  WriteMessageDocComment(printer, options(), descriptor_);
  AddDeprecatedFlag(printer);
  AddSerializableAttribute(printer);

  printer->Print(
      "[global::System.Diagnostics.DebuggerDisplayAttribute(\"{ToString(),nq}"
      "\")]\n");
  printer->Print(vars, "$access_level$ sealed partial class $class_name$ : ");

  if (has_extension_ranges_) {
    printer->Print(vars, "pb::IExtendableMessage<$class_name$>\n");
  } else {
    printer->Print(vars, "pb::IMessage<$class_name$>\n");
  }
  printer->Print("#if !GOOGLE_PROTOBUF_REFSTRUCT_COMPATIBILITY_MODE\n");
  printer->Print("    , pb::IBufferMessage\n");
  printer->Print("#endif\n");
  printer->Print("{\n");
  printer->Indent();

  // All static fields and properties
  printer->Print(
      vars,
      "private static readonly pb::MessageParser<$class_name$> _parser = new "
      "pb::MessageParser<$class_name$>(() => new $class_name$());\n");

  printer->Print("private pb::UnknownFieldSet _unknownFields;\n");

  if (has_extension_ranges_) {
    if (IsDescriptorProto(descriptor_->file())) {
      printer->Print(vars,
                     // CustomOptions compatibility
                     "internal pb::ExtensionSet<$class_name$> _extensions;\n");
    } else {
      printer->Print(vars,
                     "private pb::ExtensionSet<$class_name$> _extensions;\n");
    }

    // a read-only property for fast
    // retrieval of the set in IsInitialized
    printer->Print(vars,
                   "private pb::ExtensionSet<$class_name$> _Extensions { get { "
                   "return _extensions; } }\n");
  }

  for (int i = 0; i < has_bit_field_count_; i++) {
    // don't use arrays since all arrays are heap allocated, saving allocations
    // use ints instead of bytes since bytes lack bitwise operators, saving
    // casts
    printer->Print("private int _hasBits$i$;\n", "i", absl::StrCat(i));
  }

  WriteGeneratedCodeAttributes(printer);

  printer->Print(vars,
                 "public static pb::MessageParser<$class_name$> Parser { get { "
                 "return _parser; } }\n\n");

  // Access the message descriptor via the relevant file descriptor or
  // containing message descriptor.
  if (!descriptor_->containing_type()) {
    vars["descriptor_accessor"] =
        absl::StrCat(GetReflectionClassName(descriptor_->file()),
                     ".Descriptor.MessageTypes[", descriptor_->index(), "]");
  } else {
    vars["descriptor_accessor"] =
        absl::StrCat(GetClassName(descriptor_->containing_type()),
                     ".Descriptor.NestedTypes[", descriptor_->index(), "]");
  }

  WriteGeneratedCodeAttributes(printer);
  printer->Print(vars,
                 "public static pbr::MessageDescriptor Descriptor {\n"
                 "  get { return $descriptor_accessor$; }\n"
                 "}\n"
                 "\n");
  WriteGeneratedCodeAttributes(printer);
  printer->Print(vars,
                 "pbr::MessageDescriptor pb::IMessage.Descriptor {\n"
                 "  get { return Descriptor; }\n"
                 "}\n"
                 "\n");

  // Parameterless constructor and partial OnConstruction method.
  WriteGeneratedCodeAttributes(printer);
  printer->Print(vars,
                 "public $class_name$() {\n"
                 "  OnConstruction();\n"
                 "}\n\n"
                 "partial void OnConstruction();\n\n");

  GenerateCloningCode(printer);
  GenerateFreezingCode(printer);

  // Fields/properties
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* fieldDescriptor = descriptor_->field(i);

    // Rats: we lose the debug comment here :(
    printer->Print(
        "/// <summary>Field number for the \"$field_name$\" field.</summary>\n"
        "public const int $field_constant_name$ = $index$;\n",
        "field_name", fieldDescriptor->name(), "field_constant_name",
        GetFieldConstantName(fieldDescriptor), "index",
        absl::StrCat(fieldDescriptor->number()));
    std::unique_ptr<FieldGeneratorBase> generator(
        CreateFieldGeneratorInternal(fieldDescriptor));
    generator->GenerateMembers(printer);
    printer->Print("\n");
  }

  // oneof properties (for real oneofs, which come before synthetic ones)
  for (int i = 0; i < descriptor_->real_oneof_decl_count(); i++) {
    const OneofDescriptor* oneof = descriptor_->oneof_decl(i);
    vars["name"] = UnderscoresToCamelCase(oneof->name(), false);
    vars["property_name"] = UnderscoresToCamelCase(oneof->name(), true);
    vars["original_name"] = std::string(oneof->name());
    printer->Print(vars,
                   "private object $name$_;\n"
                   "/// <summary>Enum of possible cases for the "
                   "\"$original_name$\" oneof.</summary>\n"
                   "public enum $property_name$OneofCase {\n");
    printer->Indent();
    printer->Print("None = 0,\n");
    for (int j = 0; j < oneof->field_count(); j++) {
      const FieldDescriptor* field = oneof->field(j);
      printer->Print("$oneof_case_name$ = $index$,\n", "oneof_case_name",
                     GetOneofCaseName(field), "index",
                     absl::StrCat(field->number()));
    }
    printer->Outdent();
    printer->Print("}\n");
    // TODO: Should we put the oneof .proto comments here?
    // It's unclear exactly where they should go.
    printer->Print(vars,
                   "private $property_name$OneofCase $name$Case_ = "
                   "$property_name$OneofCase.None;\n");
    WriteGeneratedCodeAttributes(printer);
    printer->Print(vars,
                   "public $property_name$OneofCase $property_name$Case {\n"
                   "  get { return $name$Case_; }\n"
                   "}\n\n");
    WriteGeneratedCodeAttributes(printer);
    printer->Print(vars,
                   "public void Clear$property_name$() {\n"
                   "  $name$Case_ = $property_name$OneofCase.None;\n"
                   "  $name$_ = null;\n"
                   "}\n\n");
  }

  // Standard methods
  GenerateFrameworkMethods(printer);
  GenerateMessageSerializationMethods(printer);
  GenerateMergingMethods(printer);

  if (has_extension_ranges_) {
    printer->Print(
        vars,
        "public TValue GetExtension<TValue>(pb::Extension<$class_name$, "
        "TValue> extension) {\n"
        "  return pb::ExtensionSet.Get(ref _extensions, extension);\n"
        "}\n"
        "public pbc::RepeatedField<TValue> "
        "GetExtension<TValue>(pb::RepeatedExtension<$class_name$, TValue> "
        "extension) {\n"
        "  return pb::ExtensionSet.Get(ref _extensions, extension);\n"
        "}\n"
        "public pbc::RepeatedField<TValue> "
        "GetOrInitializeExtension<TValue>(pb::RepeatedExtension<$class_name$, "
        "TValue> extension) {\n"
        "  return pb::ExtensionSet.GetOrInitialize(ref _extensions, "
        "extension);\n"
        "}\n"
        "public void SetExtension<TValue>(pb::Extension<$class_name$, TValue> "
        "extension, TValue value) {\n"
        "  pb::ExtensionSet.Set(ref _extensions, extension, value);\n"
        "}\n"
        "public bool HasExtension<TValue>(pb::Extension<$class_name$, TValue> "
        "extension) {\n"
        "  return pb::ExtensionSet.Has(ref _extensions, extension);\n"
        "}\n"
        "public void ClearExtension<TValue>(pb::Extension<$class_name$, "
        "TValue> extension) {\n"
        "  pb::ExtensionSet.Clear(ref _extensions, extension);\n"
        "}\n"
        "public void "
        "ClearExtension<TValue>(pb::RepeatedExtension<$class_name$, TValue> "
        "extension) {\n"
        "  pb::ExtensionSet.Clear(ref _extensions, extension);\n"
        "}\n\n");
  }

  // Nested messages and enums
  if (HasNestedGeneratedTypes()) {
    printer->Print(vars,
                   "#region Nested types\n"
                   "/// <summary>Container for nested types declared in the "
                   "$class_name$ message type.</summary>\n");
    WriteGeneratedCodeAttributes(printer);
    printer->Print("public static partial class Types {\n");
    printer->Indent();
    for (int i = 0; i < descriptor_->enum_type_count(); i++) {
      EnumGenerator enumGenerator(descriptor_->enum_type(i), this->options());
      enumGenerator.Generate(printer);
    }
    for (int i = 0; i < descriptor_->nested_type_count(); i++) {
      // Don't generate nested types for maps...
      if (!IsMapEntryMessage(descriptor_->nested_type(i))) {
        MessageGenerator messageGenerator(descriptor_->nested_type(i),
                                          this->options());
        messageGenerator.Generate(printer);
      }
    }
    printer->Outdent();
    printer->Print(
        "}\n"
        "#endregion\n"
        "\n");
  }

  if (descriptor_->extension_count() > 0) {
    printer->Print(vars,
                   "#region Extensions\n"
                   "/// <summary>Container for extensions for other messages "
                   "declared in the $class_name$ message type.</summary>\n");
    WriteGeneratedCodeAttributes(printer);
    printer->Print("public static partial class Extensions {\n");
    printer->Indent();
    for (int i = 0; i < descriptor_->extension_count(); i++) {
      std::unique_ptr<FieldGeneratorBase> generator(
          CreateFieldGeneratorInternal(descriptor_->extension(i)));
      generator->GenerateExtensionCode(printer);
    }
    printer->Outdent();
    printer->Print(
        "}\n"
        "#endregion\n"
        "\n");
  }

  printer->Outdent();
  printer->Print("}\n");
  printer->Print("\n");
}